

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

void print_symbol_names(TextBuffer *buf,LuaSymbolList *list)

{
  undefined1 local_40 [8];
  PtrListIterator nodeiter__;
  LuaSymbol *pLStack_20;
  _Bool is_first;
  LuaSymbol *node;
  LuaSymbolList *list_local;
  TextBuffer *buf_local;
  
  nodeiter__._23_1_ = 1;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_40,(PtrList *)list);
  pLStack_20 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  while (pLStack_20 != (LuaSymbol *)0x0) {
    if ((nodeiter__._23_1_ & 1) == 0) {
      printf_buf(buf,", ");
    }
    else {
      nodeiter__._23_1_ = 0;
    }
    print_symbol_name(buf,pLStack_20);
    pLStack_20 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  }
  return;
}

Assistant:

static void print_symbol_names(TextBuffer *buf, LuaSymbolList *list)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else
			printf_buf(buf, ", ");
		print_symbol_name(buf, node);
	}
	END_FOR_EACH_PTR(node);
}